

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O3

string_view __thiscall
choc::value::Value::SimpleStringDictionary::getStringForHandle
          (SimpleStringDictionary *this,Handle handle)

{
  pointer pcVar1;
  size_t sVar2;
  char *__s;
  string_view sVar3;
  
  if (handle.handle == 0) {
    __s = (char *)0x0;
    sVar2 = 0;
  }
  else {
    pcVar1 = (this->strings).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->strings).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pcVar1) < (ulong)handle.handle) {
      throwError("Unknown string");
    }
    __s = pcVar1 + (handle.handle - 1);
    sVar2 = strlen(__s);
  }
  sVar3._M_str = __s;
  sVar3._M_len = sVar2;
  return sVar3;
}

Assistant:

inline std::string_view Value::SimpleStringDictionary::getStringForHandle (Handle handle) const
{
    if (handle == Handle())
        return {};

    if (handle.handle > strings.size())
        throwError ("Unknown string");

    return std::string_view (strings.data() + (handle.handle - 1));
}